

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O0

void canvas_dataproperties(_glist *x,t_scalar *sc,_binbuf *b)

{
  t_gobj *x_00;
  _gobj *p_Var1;
  int iVar2;
  t_template *ptVar3;
  t_word w;
  int i;
  t_template *template;
  t_gobj *oldone;
  t_gobj *newone;
  t_gobj *y2;
  t_gobj *y;
  int local_28;
  int scindex;
  int nnew;
  int ntotal;
  _binbuf *b_local;
  t_scalar *sc_local;
  _glist *x_local;
  
  template = (t_template *)0x0;
  glist_noselect(x);
  y2 = x->gl_list;
  scindex = 0;
  y._4_4_ = -1;
  for (; y2 != (t_gobj *)0x0; y2 = y2->g_next) {
    if ((t_scalar *)y2 == sc) {
      y._4_4_ = scindex;
      template = (t_template *)y2;
    }
    scindex = scindex + 1;
  }
  if (y._4_4_ == -1) {
    pd_error(x,"data_properties: scalar disappeared");
  }
  else if (b == (_binbuf *)0x0) {
    pd_error(x,"couldn\'t update properties (none given)");
  }
  else {
    glist_readfrombinbuf(x,b,"properties dialog",0);
    oldone = (t_gobj *)0x0;
    if (scindex == 0) {
      oldone = x->gl_list;
      gobj_vis(oldone,x,0);
      x->gl_list = oldone->g_next;
    }
    else {
      local_28 = 1;
      y2 = x->gl_list;
      while (x_00 = y2->g_next, x_00 != (t_gobj *)0x0) {
        if (local_28 == scindex) {
          gobj_vis(x_00,x,0);
          y2->g_next = x_00->g_next;
          oldone = x_00;
          break;
        }
        local_28 = local_28 + 1;
        y2 = x_00;
      }
    }
    if (oldone == (t_gobj *)0x0) {
      pd_error(x,"couldn\'t update properties (perhaps a format problem?)");
    }
    else if (template == (t_template *)0x0) {
      bug("data_properties: couldn\'t find old element");
    }
    else if ((((oldone->g_pd == scalar_class) && (template->t_pdobj == scalar_class)) &&
             (oldone[1].g_pd == (t_pd)template->t_sym)) &&
            (ptVar3 = template_findbyname((t_symbol *)oldone[1].g_pd), ptVar3 != (t_template *)0x0))
    {
      for (w._4_4_ = 0; (int)w._4_4_ < ptVar3->t_n; w._4_4_ = w._4_4_ + 1) {
        p_Var1 = (&oldone[1].g_next)[(int)w._4_4_];
        (&oldone[1].g_next)[(int)w._4_4_] = *(_gobj **)(&template->t_n + (long)(int)w._4_4_ * 2);
        *(_gobj **)(&template->t_n + (long)(int)w._4_4_ * 2) = p_Var1;
      }
      pd_free(&oldone->g_pd);
      iVar2 = glist_isvisible(x);
      if (iVar2 != 0) {
        gobj_vis((t_gobj *)template,x,0);
        gobj_vis((t_gobj *)template,x,1);
      }
    }
    else {
      glist_delete(x,(t_gobj *)template);
      if (y._4_4_ < 1) {
        oldone->g_next = x->gl_list;
        x->gl_list = oldone;
      }
      else {
        y2 = x->gl_list;
        local_28 = 1;
        for (; y2 != (t_gobj *)0x0; y2 = y2->g_next) {
          if ((local_28 == y._4_4_) || (y2->g_next == (_gobj *)0x0)) {
            oldone->g_next = y2->g_next;
            y2->g_next = oldone;
            return;
          }
          local_28 = local_28 + 1;
        }
        bug("data_properties: can\'t reinsert");
      }
    }
  }
  return;
}

Assistant:

void canvas_dataproperties(t_canvas *x, t_scalar *sc, t_binbuf *b)
{
    int ntotal, nnew, scindex;
    t_gobj *y, *y2 = 0, *newone, *oldone = 0;
    t_template *template;
    glist_noselect(x);
    for (y = x->gl_list, ntotal = 0, scindex = -1; y; y = y->g_next)
    {
        if (y == &sc->sc_gobj)
            scindex = ntotal, oldone = y;
        ntotal++;
    }

    if (scindex == -1)
    {
        pd_error(x, "data_properties: scalar disappeared");
        return;
    }
    if (!b) {
        pd_error(x, "couldn't update properties (none given)");
        return;
    }
    glist_readfrombinbuf(x, b, "properties dialog", 0);
    newone = 0;
        /* take the new object off the list */
    if (ntotal)
    {
        for (y = x->gl_list, nnew = 1; (y2 = y->g_next);
            y = y2, nnew++)
                if (nnew == ntotal)
        {
            newone = y2;
            gobj_vis(newone, x, 0);
            y->g_next = y2->g_next;
            break;
        }
    }
    else gobj_vis((newone = x->gl_list), x, 0), x->gl_list = newone->g_next;
    if (!newone)
        pd_error(x, "couldn't update properties (perhaps a format problem?)");
    else if (!oldone)
        bug("data_properties: couldn't find old element");
    else if (newone->g_pd == scalar_class && oldone->g_pd == scalar_class
        && ((t_scalar *)newone)->sc_template ==
            ((t_scalar *)oldone)->sc_template
        && (template = template_findbyname(((t_scalar *)newone)->sc_template)))
    {
            /* swap new one with old one; then delete new one */
        int i;
        for (i = 0; i < template->t_n; i++)
        {
            t_word w = ((t_scalar *)newone)->sc_vec[i];
            ((t_scalar *)newone)->sc_vec[i] = ((t_scalar *)oldone)->sc_vec[i];
            ((t_scalar *)oldone)->sc_vec[i] = w;
        }
        pd_free(&newone->g_pd);
        if (glist_isvisible(x))
        {
            gobj_vis(oldone, x, 0);
            gobj_vis(oldone, x, 1);
        }
    }
    else
    {
            /* delete old one; put new one where the old one was on glist */
        glist_delete(x, oldone);
        if (scindex > 0)
        {
            for (y = x->gl_list, nnew = 1; y;
                y = y->g_next, nnew++)
                    if (nnew == scindex || !y->g_next)
            {
                newone->g_next = y->g_next;
                y->g_next = newone;
                goto didit;
            }
            bug("data_properties: can't reinsert");
        }
        else newone->g_next = x->gl_list, x->gl_list = newone;
    }
didit:
    ;
}